

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v7::detail::bigint::square(bigint *this)

{
  uint uVar1;
  int iVar2;
  type tVar3;
  size_t sVar4;
  uint *puVar5;
  bigit *pbVar6;
  bool bVar7;
  int local_100;
  int local_fc;
  int i_1;
  int j_1;
  int bigit_index_1;
  int j;
  int i;
  int bigit_index;
  accumulator_t sum;
  int num_result_bigits;
  int num_bigits;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  bigint *this_local;
  
  n._160_8_ = this;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            ((basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)
             &num_result_bigits,&this->bigits_);
  sVar4 = buffer<unsigned_int>::size((buffer<unsigned_int> *)this);
  iVar2 = (int)sVar4;
  tVar3 = to_unsigned<int>(iVar2 * 2);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::resize
            (&this->bigits_,(ulong)tVar3);
  sum._0_8_ = 0;
  _i = 0;
  for (j = 0; i_1 = iVar2, j < iVar2; j = j + 1) {
    bigit_index_1 = 0;
    for (j_1 = j; -1 < j_1; j_1 = j_1 + -1) {
      puVar5 = buffer<unsigned_int>::operator[]<int>
                         ((buffer<unsigned_int> *)&num_result_bigits,bigit_index_1);
      uVar1 = *puVar5;
      puVar5 = buffer<unsigned_int>::operator[]<int>((buffer<unsigned_int> *)&num_result_bigits,j_1)
      ;
      bVar7 = CARRY8(_i,(ulong)uVar1 * (ulong)*puVar5);
      _i = _i + (ulong)uVar1 * (ulong)*puVar5;
      sum._0_8_ = (ulong)sum + bVar7;
      bigit_index_1 = bigit_index_1 + 1;
    }
    pbVar6 = operator[](this,j);
    *pbVar6 = i;
    _i = (ulong)sum << 0x20 | _i >> 0x20;
    sum._0_8_ = (ulong)sum >> 0x20;
  }
  for (; i_1 < iVar2 * 2; i_1 = i_1 + 1) {
    local_100 = i_1 - (iVar2 + -1);
    local_fc = iVar2 + -1;
    while (local_100 < iVar2) {
      puVar5 = buffer<unsigned_int>::operator[]<int>
                         ((buffer<unsigned_int> *)&num_result_bigits,local_100);
      uVar1 = *puVar5;
      puVar5 = buffer<unsigned_int>::operator[]<int>
                         ((buffer<unsigned_int> *)&num_result_bigits,local_fc);
      bVar7 = CARRY8(_i,(ulong)uVar1 * (ulong)*puVar5);
      _i = _i + (ulong)uVar1 * (ulong)*puVar5;
      sum._0_8_ = (ulong)sum + bVar7;
      local_100 = local_100 + 1;
      local_fc = local_fc + -1;
    }
    pbVar6 = operator[](this,i_1);
    *pbVar6 = i;
    _i = (ulong)sum << 0x20 | _i >> 0x20;
    sum._0_8_ = (ulong)sum >> 0x20;
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::~basic_memory_buffer
            ((basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)
             &num_result_bigits);
  return;
}

Assistant:

void square() {
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    bigits_.resize(to_unsigned(num_result_bigits));
    using accumulator_t = conditional_t<FMT_USE_INT128, uint128_t, accumulator>;
    auto sum = accumulator_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;
    }
    --num_result_bigits;
    remove_leading_zeros();
    exp_ *= 2;
  }